

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

void do_put(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  OBJ_DATA *obj;
  OBJ_DATA *pOVar6;
  OBJ_DATA *pOVar7;
  char *format;
  char arg2 [4608];
  char arg1 [4608];
  OBJ_DATA local_2438 [13];
  char local_1238 [3];
  char local_1235;
  char local_1234 [4612];
  
  pOVar7 = local_2438;
  pcVar5 = one_argument(argument,local_1238);
  pcVar5 = one_argument(pcVar5,(char *)local_2438);
  bVar2 = str_cmp((char *)local_2438,"in");
  if ((!bVar2) || (bVar2 = str_cmp((char *)local_2438,"on"), !bVar2)) {
    one_argument(pcVar5,(char *)local_2438);
  }
  if ((local_1238[0] == '\0') || ((char)local_2438[0].next == '\0')) {
    pcVar5 = "Put what in what?\n\r";
LAB_0025a487:
    send_to_char(pcVar5,ch);
    return;
  }
  bVar2 = str_cmp((char *)local_2438,"all");
  if ((!bVar2) || (bVar2 = str_prefix("all.",(char *)local_2438), !bVar2)) {
    pcVar5 = "You can\'t do that.\n\r";
    goto LAB_0025a487;
  }
  obj = get_obj_here(ch,(char *)local_2438);
  if (obj == (OBJ_DATA *)0x0) {
    pcVar5 = "I see no $T here.";
  }
  else {
    if (obj->item_type != 0xf) {
      pcVar5 = "That\'s not a container.\n\r";
      goto LAB_0025a487;
    }
    bVar2 = is_affected_obj(obj,(int)gsn_ice_blast);
    if (bVar2) {
      pcVar5 = "$p is frozen shut!";
      pOVar7 = (OBJ_DATA *)0x0;
      pOVar6 = obj;
      goto LAB_0025a4b0;
    }
    if ((obj->value[1] & 4) == 0) {
      bVar2 = str_cmp(local_1238,"all");
      if ((!bVar2) || (bVar2 = str_prefix("all.",local_1238), !bVar2)) {
        if (ch->carrying == (OBJ_DATA *)0x0) {
          return;
        }
        pOVar7 = ch->carrying;
        do {
          pOVar6 = pOVar7->next_content;
          if (((((local_1235 == '\0') || (bVar2 = is_name(local_1234,pOVar7->name), bVar2)) &&
               (bVar2 = can_see_obj(ch,pOVar7), bVar2)) &&
              ((iVar3 = weight_mult(pOVar7), iVar3 == 100 && (pOVar7 != obj)))) &&
             ((pOVar7->wear_loc == -1 &&
              ((pOVar7->pIndexData->limtotal < 1 &&
               (iVar3 = get_contents_number(obj), iVar3 < obj->value[0])))))) {
            iVar3 = get_contents_weight(obj);
            iVar4 = get_true_weight(pOVar7);
            if ((iVar4 + iVar3 <= obj->value[3]) &&
               ((bVar2 = can_drop_obj(ch,pOVar7), bVar2 && (bVar2 = isCabalItem(pOVar7), !bVar2))))
            {
              if ((obj->pIndexData->vnum == 0xaec) && (bVar2 = can_wear(pOVar7,0), !bVar2)) {
                iVar3 = number_range(100,200);
                pOVar7->timer = (short)iVar3;
              }
              obj_from_char(pOVar7);
              obj_to_obj(pOVar7,obj);
              bVar2 = (obj->value[1] & 0x10) == 0;
              pcVar5 = "$n puts $p on $P.";
              if (bVar2) {
                pcVar5 = "$n puts $p in $P.";
              }
              format = "You put $p on $P.";
              if (bVar2) {
                format = "You put $p in $P.";
              }
              act(pcVar5,ch,pOVar7,obj,0);
              act(format,ch,pOVar7,obj,3);
            }
          }
          pOVar7 = pOVar6;
        } while (pOVar6 != (OBJ_DATA *)0x0);
        return;
      }
      pOVar6 = get_obj_carry(ch,local_1238,ch);
      if (pOVar6 == (OBJ_DATA *)0x0) {
        pcVar5 = "You do not have that item.\n\r";
      }
      else if (pOVar6 == obj) {
        pcVar5 = "You can\'t fold it into itself.\n\r";
      }
      else {
        bVar2 = can_drop_obj(ch,pOVar6);
        if (bVar2) {
          bVar2 = isCabalItem(pOVar6);
          if ((bVar2) || ((0 < pOVar6->pIndexData->limtotal && (obj->pIndexData->vnum != 0x1f)))) {
            pcVar5 = "That item is too powerful to be contained.\n\r";
          }
          else {
            bVar2 = is_obj_stat(pOVar6,0x1f);
            if (bVar2) {
              pcVar5 = "You can\'t put that inside a container!\n\r";
            }
            else {
              iVar3 = weight_mult(pOVar6);
              if ((iVar3 == 100) || (obj->pIndexData->vnum == 0x1f)) {
                iVar3 = get_contents_number(obj);
                if (iVar3 < obj->value[0]) {
                  iVar3 = get_contents_weight(obj);
                  iVar4 = get_true_weight(pOVar6);
                  if (iVar4 + iVar3 <= obj->value[3]) {
                    if ((obj->pIndexData->vnum == 0xaec) && (bVar2 = can_wear(obj,0), !bVar2)) {
                      iVar3 = number_range(100,200);
                      pOVar6->timer = (short)iVar3;
                    }
                    obj_from_char(pOVar6);
                    obj_to_obj(pOVar6,obj);
                    iVar3 = get_skill(ch,(int)gsn_palm);
                    if ((iVar3 != 0) && (bVar2 = is_affected_by(ch,0xf), bVar2)) {
                      iVar4 = number_percent();
                      uVar1 = obj->value[1];
                      pcVar5 = "You attempt to silently put $p on $P.";
                      if ((uVar1 & 0x10) == 0) {
                        pcVar5 = "You attempt to silently put $p in $P.";
                      }
                      act(pcVar5,ch,pOVar6,obj,3);
                      if (iVar4 < iVar3) {
                        pcVar5 = "IMM: $n palmed $p on $P";
                        if ((uVar1 & 0x10) == 0) {
                          pcVar5 = "IMM: $n palmed $p in $P";
                        }
                        act(pcVar5,ch,pOVar6,obj,5);
                        bVar2 = true;
                      }
                      else {
                        pcVar5 = "$n puts $p on $P.";
                        if ((uVar1 & 0x10) == 0) {
                          pcVar5 = "$n puts $p in $P.";
                        }
                        act(pcVar5,ch,pOVar6,obj,0);
                        bVar2 = false;
                      }
                      check_improve(ch,(int)gsn_palm,bVar2,1);
                      return;
                    }
                    pOVar7 = obj;
                    if ((obj->value[1] & 0x10) == 0) {
                      act("$n puts $p in $P.",ch,pOVar6,obj,0);
                      pcVar5 = "You put $p in $P.";
                    }
                    else {
                      act("$n puts $p on $P.",ch,pOVar6,obj,0);
                      pcVar5 = "You put $p on $P.";
                    }
                    goto LAB_0025a4b0;
                  }
                }
                pcVar5 = "It won\'t fit.\n\r";
              }
              else {
                pcVar5 = "You have a feeling that would be a bad idea.\n\r";
              }
            }
          }
        }
        else {
          pcVar5 = "You can\'t let go of it.\n\r";
        }
      }
      goto LAB_0025a487;
    }
    pOVar7 = (OBJ_DATA *)obj->name;
    pcVar5 = "The $d is closed.";
  }
  pOVar6 = (OBJ_DATA *)0x0;
LAB_0025a4b0:
  act(pcVar5,ch,pOVar6,pOVar7,3);
  return;
}

Assistant:

void do_put(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	OBJ_DATA *container;
	OBJ_DATA *obj;
	OBJ_DATA *obj_next;
	int pchance;
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (!str_cmp(arg2, "in") || !str_cmp(arg2, "on"))
		argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Put what in what?\n\r", ch);
		return;
	}

	if (!str_cmp(arg2, "all") || !str_prefix("all.", arg2))
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	container = get_obj_here(ch, arg2);

	if (container == nullptr)
	{
		act("I see no $T here.", ch, nullptr, arg2, TO_CHAR);
		return;
	}

	if (container->item_type != ITEM_CONTAINER)
	{
		send_to_char("That's not a container.\n\r", ch);
		return;
	}

	if (is_affected_obj(container, gsn_ice_blast))
	{
		act("$p is frozen shut!", ch, container, 0, TO_CHAR);
		return;
	}

	if (IS_SET_OLD(container->value[1], CONT_CLOSED))
	{
		act("The $d is closed.", ch, nullptr, container->name, TO_CHAR);
		return;
	}

	if (str_cmp(arg1, "all") && str_prefix("all.", arg1))
	{
		/* 'put obj container' */
		obj = get_obj_carry(ch, arg1, ch);

		if (obj == nullptr)
		{
			send_to_char("You do not have that item.\n\r", ch);
			return;
		}

		if (obj == container)
		{
			send_to_char("You can't fold it into itself.\n\r", ch);
			return;
		}

		if (!can_drop_obj(ch, obj))
		{
			send_to_char("You can't let go of it.\n\r", ch);
			return;
		}

		if (isCabalItem(obj))
		{
			send_to_char("That item is too powerful to be contained.\n\r", ch);
			return;
		}

		if (obj->pIndexData->limtotal > 0 && container->pIndexData->vnum != 31)
		{
			send_to_char("That item is too powerful to be contained.\n\r", ch);
			return;
		}

		if (is_obj_stat(obj, ITEM_NO_STASH))
		{
			send_to_char("You can't put that inside a container!\n\r", ch);
			return;
		}

		if (weight_mult(obj) != 100 && container->pIndexData->vnum != 31)
		{
			send_to_char("You have a feeling that would be a bad idea.\n\r", ch);
			return;
		}

		if (get_contents_number(container) >= container->value[0]
			|| (get_contents_weight(container) + get_true_weight(obj) > container->value[3]))
		{
			send_to_char("It won't fit.\n\r", ch);
			return;
		}

		if (container->pIndexData->vnum == OBJ_VNUM_PIT && !can_wear(container, ITEM_TAKE))
		{
			obj->timer = number_range(100, 200);
		}

		obj_from_char(obj);
		obj_to_obj(obj, container);

		pchance = get_skill(ch, gsn_palm);

		if (pchance != 0 && is_affected_by(ch, AFF_SNEAK))
		{
			if (number_percent() < pchance)
			{
				if (IS_SET_OLD(container->value[1], CONT_PUT_ON))
				{
					act("You attempt to silently put $p on $P.", ch, obj, container, TO_CHAR);
					act("IMM: $n palmed $p on $P", ch, obj, container, TO_IMMINROOM);
				}
				else
				{
					act("You attempt to silently put $p in $P.", ch, obj, container, TO_CHAR);
					act("IMM: $n palmed $p in $P", ch, obj, container, TO_IMMINROOM);
				}
				check_improve(ch, gsn_palm, true, 1);
			}
			else
			{
				if (IS_SET_OLD(container->value[1], CONT_PUT_ON))
				{
					act("You attempt to silently put $p on $P.", ch, obj, container, TO_CHAR);
					act("$n puts $p on $P.", ch, obj, container, TO_ROOM);
				}
				else
				{
					act("You attempt to silently put $p in $P.", ch, obj, container, TO_CHAR);
					act("$n puts $p in $P.", ch, obj, container, TO_ROOM);
				}

				check_improve(ch, gsn_palm, false, 1);
			}
		}
		else
		{
			if (IS_SET_OLD(container->value[1], CONT_PUT_ON))
			{
				act("$n puts $p on $P.", ch, obj, container, TO_ROOM);
				act("You put $p on $P.", ch, obj, container, TO_CHAR);
			}
			else
			{
				act("$n puts $p in $P.", ch, obj, container, TO_ROOM);
				act("You put $p in $P.", ch, obj, container, TO_CHAR);
			}
		}
	}
	else
	{
		/* 'put all container' or 'put all.obj container' */
		for (obj = ch->carrying; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			if ((arg1[3] == '\0' || is_name(&arg1[4], obj->name))
				&& can_see_obj(ch, obj)
				&& weight_mult(obj) == 100
				&& obj->wear_loc == WEAR_NONE
				&& obj != container
				&& obj->pIndexData->limtotal <= 0
				&& get_contents_number(container) < container->value[0]
				&& (get_contents_weight(container) + get_true_weight(obj) <= container->value[3])
				&& can_drop_obj(ch, obj)
				&& (!isCabalItem(obj)))
			{
				if (container->pIndexData->vnum == OBJ_VNUM_PIT && !can_wear(obj, ITEM_TAKE))
				{
					obj->timer = number_range(100, 200);
				}

				obj_from_char(obj);
				obj_to_obj(obj, container);

				if (IS_SET_OLD(container->value[1], CONT_PUT_ON))
				{
					act("$n puts $p on $P.", ch, obj, container, TO_ROOM);
					act("You put $p on $P.", ch, obj, container, TO_CHAR);
				}
				else
				{
					act("$n puts $p in $P.", ch, obj, container, TO_ROOM);
					act("You put $p in $P.", ch, obj, container, TO_CHAR);
				}
			}
		}
	}
}